

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

U32 ZSTD_VecMask_next(ZSTD_VecMask val)

{
  U32 UVar1;
  ZSTD_VecMask val_local;
  
  UVar1 = 0;
  for (; (val & 1) == 0; val = val >> 1 | 0x80000000) {
    UVar1 = UVar1 + 1;
  }
  return UVar1;
}

Assistant:

static U32 ZSTD_VecMask_next(ZSTD_VecMask val) {
#   if defined(_MSC_VER)   /* Visual */
    unsigned long r=0;
    return _BitScanForward(&r, val) ? (U32)r : 0;
#   elif defined(__GNUC__) && (__GNUC__ >= 3)
    return (U32)__builtin_ctz(val);
#   else
    /* Software ctz version: http://graphics.stanford.edu/~seander/bithacks.html#ZerosOnRightMultLookup */
    static const U32 multiplyDeBruijnBitPosition[32] =
    {
        0, 1, 28, 2, 29, 14, 24, 3, 30, 22, 20, 15, 25, 17, 4, 8,
		31, 27, 13, 23, 21, 19, 16, 7, 26, 12, 18, 6, 11, 5, 10, 9
    };
	return multiplyDeBruijnBitPosition[((U32)((val & -(int)val) * 0x077CB531U)) >> 27];

#   endif
}